

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::initiatorFixtureDisconnect_ResetOnDisconnectHelper::
~initiatorFixtureDisconnect_ResetOnDisconnectHelper
          (initiatorFixtureDisconnect_ResetOnDisconnectHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  operator_delete(&this[-1].m_details,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, Disconnect_ResetOnDisconnect) {
  startLoggedOn();

  object->setResetOnDisconnect(true);

  object->setNextSenderMsgSeqNum(20);
  object->setNextTargetMsgSeqNum(20);

  object->disconnect();

  CHECK_EQUAL(1, object->getExpectedSenderNum());
  CHECK_EQUAL(1, object->getExpectedTargetNum());

}